

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void FPolyObj::ClearAllSubsectorLinks(void)

{
  FPolyNode *pFVar1;
  FPolyNode *pFVar2;
  long lVar3;
  long lVar4;
  
  pFVar2 = FreePolyNodes;
  if (0 < po_NumPolyobjs) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      ClearSubsectorLinks((FPolyObj *)((long)(polyobjs->Bounds).m_Box + lVar3 + -0x70));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xf0;
      pFVar2 = FreePolyNodes;
    } while (lVar4 < po_NumPolyobjs);
  }
  while (pFVar2 != (FPolyNode *)0x0) {
    pFVar1 = pFVar2->pnext;
    TArray<FPolySeg,_FPolySeg>::~TArray(&pFVar2->segs);
    operator_delete(pFVar2,0x40);
    pFVar2 = pFVar1;
  }
  return;
}

Assistant:

void FPolyObj::ClearAllSubsectorLinks()
{
	for (int i = 0; i < po_NumPolyobjs; i++)
	{
		polyobjs[i].ClearSubsectorLinks();
	}
	ReleaseAllPolyNodes();
}